

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskDataset.cpp
# Opt level: O3

void __thiscall OnDiskDataset::save(OnDiskDataset *this)

{
  pointer pOVar1;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> fname_cache;
  source_loc loc;
  logger *this_00;
  OnDiskIndex *name;
  pointer pOVar2;
  string_view_t fmt;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  index_names;
  undefined7 uStack_6f;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  
  local_50._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_50._M_impl.super__Rb_tree_header._M_header;
  local_50._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_50._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_50._M_impl.super__Rb_tree_header._M_node_count = 0;
  pOVar2 = (this->indices).super__Vector_base<OnDiskIndex,_std::allocator<OnDiskIndex>_>._M_impl.
           super__Vector_impl_data._M_start;
  pOVar1 = (this->indices).super__Vector_base<OnDiskIndex,_std::allocator<OnDiskIndex>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_50._M_impl.super__Rb_tree_header._M_header._M_right =
       local_50._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pOVar2 != pOVar1) {
    do {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&local_50,&pOVar2->fname);
      pOVar2 = pOVar2 + 1;
    } while (pOVar2 != pOVar1);
  }
  fname_cache.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._17_7_ =
       uStack_6f;
  fname_cache.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_engaged =
       true;
  fname_cache.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_str =
       (pointer)(this->files_index).super__Optional_base<OnDiskFileIndex,_false,_false>._M_payload.
                super__Optional_payload<OnDiskFileIndex,_true,_false,_false>.
                super__Optional_payload_base<OnDiskFileIndex>._M_payload._M_value.cache_fname.
                _M_dataplus;
  fname_cache.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_len =
       *(size_type *)
        ((long)&(this->files_index).super__Optional_base<OnDiskFileIndex,_false,_false>._M_payload.
                super__Optional_payload<OnDiskFileIndex,_true,_false,_false>.
                super__Optional_payload_base<OnDiskFileIndex>._M_payload._M_value.cache_fname + 8);
  store_dataset(&this->db_base,&this->name,
                (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_50,
                &(this->files_index).super__Optional_base<OnDiskFileIndex,_false,_false>._M_payload.
                 super__Optional_payload<OnDiskFileIndex,_true,_false,_false>.
                 super__Optional_payload_base<OnDiskFileIndex>._M_payload._M_value.files_fname,
                fname_cache,&this->taints);
  this_00 = spdlog::default_logger_raw();
  loc.funcname = (char *)0x0;
  loc.filename = (char *)0x0;
  loc.line = 0;
  loc._12_4_ = 0;
  fmt.size_ = 8;
  fmt.data_ = "SAVE: {}";
  spdlog::logger::log<std::__cxx11::string>(this_00,loc,info,fmt,&this->name);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_50);
  return;
}

Assistant:

void OnDiskDataset::save() {
    std::set<std::string> index_names;
    for (const auto &name : indices) {
        index_names.insert(name.get_fname());
    }

    store_dataset(db_base, name, index_names, files_index->get_files_fname(),
                  files_index->get_cache_fname(), taints);
    spdlog::info("SAVE: {}", name);
}